

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O0

void __thiscall
sigslot::
_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::slot_disconnect(_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                  *this,has_slots<sigslot::multi_threaded_local> *pslot)

{
  bool bVar1;
  reference pp_Var2;
  has_slots<sigslot::multi_threaded_local> *phVar3;
  const_iterator local_50 [3];
  _List_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  local_38;
  iterator itNext;
  iterator itEnd;
  iterator it;
  lock_block<sigslot::multi_threaded_local> lock;
  has_slots<sigslot::multi_threaded_local> *pslot_local;
  _signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  *this_local;
  
  lock_block<sigslot::multi_threaded_local>::lock_block
            ((lock_block<sigslot::multi_threaded_local> *)&it,(multi_threaded_local *)this);
  itEnd._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::begin(&this->m_connected_slots);
  itNext._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::end(&this->m_connected_slots);
  while( true ) {
    bVar1 = std::operator!=(&itEnd,&itNext);
    if (!bVar1) break;
    local_38._M_node = itEnd._M_node;
    std::
    _List_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
    ::operator++(&local_38);
    pp_Var2 = std::
              _List_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
              ::operator*(&itEnd);
    phVar3 = (has_slots<sigslot::multi_threaded_local> *)(**(code **)(*(long *)*pp_Var2 + 0x10))();
    if (phVar3 == pslot) {
      pp_Var2 = std::
                _List_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
                ::operator*(&itEnd);
      if (*pp_Var2 !=
          (_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
           *)0x0) {
        (**(code **)(*(long *)*pp_Var2 + 8))();
      }
      std::
      _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
      ::_List_const_iterator(local_50,&itEnd);
      std::__cxx11::
      list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
      ::erase(&this->m_connected_slots,local_50[0]);
    }
    itEnd._M_node = local_38._M_node;
  }
  lock_block<sigslot::multi_threaded_local>::~lock_block
            ((lock_block<sigslot::multi_threaded_local> *)&it);
  return;
}

Assistant:

void slot_disconnect(has_slots<mt_policy>* pslot)
		{
			lock_block<mt_policy> lock(this);
			iterator it = m_connected_slots.begin();
			iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				iterator itNext = it;
				++itNext;

				if((*it)->getdest() == pslot)
				{
					delete *it;
					m_connected_slots.erase(it);
				}

				it = itNext;
			}
		}